

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

size_t __thiscall UdpSocketImpl::Read(UdpSocketImpl *this,void *buf,size_t len,string *strFrom)

{
  mutex *__mutex;
  _Head_base<1UL,_unsigned_long,_false> __n;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> __s;
  unsigned_long __n2;
  unsigned_long __n2_1;
  ulong __n_00;
  __array tmp;
  size_t nRest;
  DATA data;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_80;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_78;
  string *local_70;
  ulong local_68;
  _Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  __n._M_head_impl = 0;
  if (((len != 0) && (buf != (void *)0x0)) &&
     ((this->m_atInBytes).super___atomic_base<unsigned_long>._M_i != 0)) {
    __mutex = &this->m_mxInDeque;
    local_70 = strFrom;
    std::mutex::lock(__mutex);
    std::
    _Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Tuple_impl(&local_60,
                  &((this->m_quInData).
                    super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
    local_78 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                *)&this->m_quInData;
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop_front(&this->m_quInData);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    __n._M_head_impl = len;
    if (local_60.
        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl < len) {
      __n._M_head_impl =
           local_60.
           super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    }
    if (local_60.
        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl != 0) {
      memmove(buf,(void *)local_60.
                          super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                          ._M_head_impl._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
              __n._M_head_impl);
    }
    LOCK();
    (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
         (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i - __n._M_head_impl;
    UNLOCK();
    std::__cxx11::string::_M_assign((string *)local_70);
    __n_00 = local_60.
             super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl - __n._M_head_impl;
    if (__n._M_head_impl <=
        local_60.
        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl && __n_00 != 0) {
      local_68 = __n_00;
      __s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
           operator_new__(__n_00);
      memset((void *)__s.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n_00);
      local_80._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
           (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
           __s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      memmove((void *)__s.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
              (uchar *)((long)local_60.
                              super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                              ._M_head_impl._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                       __n._M_head_impl),
              local_60.
              super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
      std::mutex::lock(__mutex);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
      ::
      emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                (local_78,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &local_80,&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_80);
    }
    std::
    _Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl(&local_60);
  }
  return __n._M_head_impl;
}

Assistant:

size_t UdpSocketImpl::Read(void* buf, size_t len, string& strFrom)
{
    if (m_atInBytes == 0 || buf == nullptr || len == 0)
        return 0;

    size_t nOffset = 0;
    size_t nRet = 0;

    m_mxInDeque.lock();
    DATA data = move(m_quInData.front());
    m_quInData.pop_front();
    m_mxInDeque.unlock();

    // Copy the data into the destination buffer
    const size_t nToCopy = min(BUFLEN(data), len);
    copy_n(&BUFFER(data)[0], nToCopy, &static_cast<uint8_t*>(buf)[nOffset]);
    m_atInBytes -= nToCopy;
    strFrom = ADDRESS(data);
    nRet += nToCopy;

    if (nToCopy < BUFLEN(data))
    {   // Put the Rest of the Data back to the Que
        size_t nRest = BUFLEN(data) - nToCopy;
        auto tmp = make_unique<uint8_t[]>(nRest);
        copy_n(&BUFFER(data)[nToCopy], nToCopy + nRest, &tmp[0]);
        m_mxInDeque.lock();
        m_quInData.emplace_front(move(tmp), nRest, ADDRESS(data));
        m_mxInDeque.unlock();
    }

    return nRet;
}